

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O0

Sections __thiscall QFileSystemTreeView::visibleSections(QFileSystemTreeView *this)

{
  bool bVar1;
  int iVar2;
  anon_class_8_1_8991fb9c *in_RDI;
  anon_class_8_1_8991fb9c isSectionHidden;
  Sections sections;
  Column in_stack_ffffffffffffffdc;
  QFlags<QFileSystemTreeView::Section> local_4;
  
  QFlags<QFileSystemTreeView::Section>::QFlags(&local_4,All);
  QTreeView::header();
  iVar2 = QHeaderView::hiddenSectionCount();
  if (0 < iVar2) {
    bVar1 = visibleSections::anon_class_8_1_8991fb9c::operator()(in_RDI,in_stack_ffffffffffffffdc);
    if (!bVar1) {
      QFlags<QFileSystemTreeView::Section>::operator|=(&local_4,Name);
    }
    bVar1 = visibleSections::anon_class_8_1_8991fb9c::operator()(in_RDI,in_stack_ffffffffffffffdc);
    if (!bVar1) {
      QFlags<QFileSystemTreeView::Section>::operator|=(&local_4,Size);
    }
    bVar1 = visibleSections::anon_class_8_1_8991fb9c::operator()(in_RDI,in_stack_ffffffffffffffdc);
    if (!bVar1) {
      QFlags<QFileSystemTreeView::Section>::operator|=(&local_4,Type);
    }
    bVar1 = visibleSections::anon_class_8_1_8991fb9c::operator()(in_RDI,in_stack_ffffffffffffffdc);
    if (!bVar1) {
      QFlags<QFileSystemTreeView::Section>::operator|=(&local_4,LastModification);
    }
  }
  return (Sections)local_4.i;
}

Assistant:

QFileSystemTreeView::Sections QFileSystemTreeView::visibleSections() const {
    const auto isSectionHidden = [this](QFileSystemTreeView::Column column) {
        return header()->isSectionHidden(static_cast<int>(column));
    };
    QFileSystemTreeView::Sections sections = QFileSystemTreeView::Section::All;

    if (header()->hiddenSectionCount() > 0) {
        if (!isSectionHidden(QFileSystemTreeView::Column::Name)) {
            sections |= QFileSystemTreeView::Section::Name;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::Size)) {
            sections |= QFileSystemTreeView::Section::Size;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::Type)) {
            sections |= QFileSystemTreeView::Section::Type;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::LastModification)) {
            sections |= QFileSystemTreeView::Section::LastModification;
        }
    }

    return sections;
}